

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O0

void dyn_tbl_update(dyn_tbl_t *dyn_tbl,uchar *key_str,int val)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  int in_EDX;
  void *in_RSI;
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  *in_RDI;
  longlong value;
  iterator it_1;
  iterator it;
  longlong min;
  uint frac;
  dyn_tbl_key_t key;
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  *in_stack_ffffffffffffff38;
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  *in_stack_ffffffffffffff40;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> __position;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_98;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_90;
  ulong local_88;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_80;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_78;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_70;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_68;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_60;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_58;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_50;
  __node_type *local_48;
  int local_3c;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_38;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_30;
  undefined1 local_21 [13];
  int local_14;
  void *local_10;
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_21,0,0xd);
  memcpy(local_21,local_10,(ulong)((uint)local_8[1]._M_h._M_rehash_policy._M_max_load_factor >> 3));
  local_8[1]._M_h._M_buckets = (__buckets_ptr)((long)local_14 + (long)local_8[1]._M_h._M_buckets);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x103fe6);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    pmVar3 = std::
             unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
             ::operator[](in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
    *pmVar3 = (long)local_14 + *pmVar3;
  }
  else {
    local_3c = (int)((long)local_8[1]._M_h._M_buckets / (long)local_8[1]._M_h._M_before_begin._M_nxt
                    );
    sVar2 = std::
            unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
            ::size((unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                    *)0x10407e);
    if (sVar2 < (uint)local_8[1]._M_h._M_bucket_count) {
      pmVar3 = std::
               unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
               ::operator[](in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
      *pmVar3 = (long)local_14;
    }
    else if ((uint)local_8[1]._M_h._M_bucket_count < (local_3c + 1) * (local_3c + 2) - 1U) {
      *(int *)&local_8[1]._M_h._M_bucket_count = (local_3c + 1) * (local_3c + 2) + -1;
      pmVar3 = std::
               unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
               ::operator[](in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
      *pmVar3 = (long)local_14;
    }
    else {
      local_48 = (__node_type *)(long)local_14;
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
           ::begin(in_stack_ffffffffffffff38);
      while( true ) {
        local_58._M_cur =
             (__node_type *)
             std::
             unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
             ::end(in_stack_ffffffffffffff38);
        bVar1 = std::__detail::operator!=(&local_50,&local_58);
        if (!bVar1) break;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>::operator->
                           ((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
                             *)0x10418d);
        if (ppVar4->second < (long)local_48) {
          ppVar4 = std::__detail::
                   _Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
                               *)0x1041a5);
          local_48 = (__node_type *)ppVar4->second;
        }
        std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>::
        operator++((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true> *)
                   in_stack_ffffffffffffff40);
      }
      *(int *)((long)&local_8[1]._M_h._M_bucket_count + 4) =
           *(int *)((long)&local_8[1]._M_h._M_bucket_count + 4) + (int)local_48;
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
           ::begin(in_stack_ffffffffffffff38);
      while( true ) {
        local_68._M_cur =
             (__node_type *)
             std::
             unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
             ::end(in_stack_ffffffffffffff38);
        bVar1 = std::__detail::operator!=(&local_60,&local_68);
        if (!bVar1) break;
        __position._M_cur = local_48;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>::operator->
                           ((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
                             *)0x10422b);
        ppVar4->second = ppVar4->second - (long)__position._M_cur;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>::operator->
                           ((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
                             *)0x104245);
        if (ppVar4->second < 1) {
          in_stack_ffffffffffffff40 = local_8;
          local_70._M_cur =
               (__node_type *)
               std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
               ::operator++((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
                             *)in_stack_ffffffffffffff38,0);
          local_78._M_cur =
               (__node_type *)
               std::
               unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
               ::erase(in_stack_ffffffffffffff40,__position._M_cur);
        }
        else {
          local_80._M_cur =
               (__node_type *)
               std::__detail::_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
               ::operator++((_Node_iterator<std::pair<const_dyn_tbl_key_s,_long_long>,_false,_true>
                             *)in_stack_ffffffffffffff38,0);
        }
      }
      if ((long)local_48 < (long)local_14) {
        sVar2 = std::
                unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                ::size((unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                        *)0x1042b8);
        if ((uint)local_8[1]._M_h._M_bucket_count <= sVar2) {
          fprintf(_stderr,"Warning: maj tbl update error\n");
        }
        in_stack_ffffffffffffff38 =
             (unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
              *)((long)local_14 - (long)local_48);
        pmVar3 = std::
                 unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
                 ::operator[](in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
        *pmVar3 = (mapped_type)in_stack_ffffffffffffff38;
      }
    }
  }
  local_88 = 0;
  local_90._M_cur =
       (__node_type *)
       std::
       unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x104334);
  local_98._M_cur =
       (__node_type *)
       std::
       unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::__detail::operator!=(&local_90,&local_98);
  if (bVar1) {
    pmVar3 = std::
             unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
             ::operator[](in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
    local_88 = *pmVar3 + (ulong)*(uint *)((long)&local_8[1]._M_h._M_bucket_count + 4);
  }
  else {
    local_88 = (ulong)*(uint *)((long)&local_8[1]._M_h._M_bucket_count + 4);
  }
  if ((long)local_8[1]._M_h._M_element_count < (long)local_88) {
    local_8[1]._M_h._M_element_count = local_88;
  }
  return;
}

Assistant:

void dyn_tbl_update(dyn_tbl_t* dyn_tbl, unsigned char* key_str, int val) {
	dyn_tbl_key_t key;
	memset(key.key, 0, sizeof(key.key));
	memcpy(key.key, key_str, dyn_tbl->lgn / 8);
	dyn_tbl->total += val;

	if (dyn_tbl->array.find(key) != dyn_tbl->array.end()) {
		dyn_tbl->array[key] += val;
	}
	else {
		unsigned int frac = dyn_tbl->total / dyn_tbl->T;
		if (dyn_tbl->array.size() < dyn_tbl->max_len) {
			dyn_tbl->array[key] = val;
		}
		else if (dyn_tbl->max_len < (frac + 1) * (frac + 2) - 1) {
			dyn_tbl->max_len = (frac + 1) * (frac + 2) - 1;
			dyn_tbl->array[key] = val;
		}
		else {
			// std::unordered_map<dyn_tbl_key_t, long long>::iterator it;
			long long min = val;
			for (auto it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
				if (it->second < min) {
					min = it->second;
				}
			}
			dyn_tbl->decrement += min;
			for (auto it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ) {
				it->second -= min;
				if (it->second <= 0) {
					dyn_tbl->array.erase(it++);
				}
				else {
					it++;
				}
			}
			if (min < val) {
				if (dyn_tbl->array.size() >= dyn_tbl->max_len) {
					fprintf(stderr, "Warning: maj tbl update error\n");
				}
				dyn_tbl->array[key] = val - min;
			}
		}
	}
	long long value = 0;
	if (dyn_tbl->array.find(key) != dyn_tbl->array.end()) {
		value = dyn_tbl->array[key] + dyn_tbl->decrement;
	}
	else {
		value = dyn_tbl->decrement;
	}
	if (value > dyn_tbl->max_value)
		dyn_tbl->max_value = value;
}